

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HFactor.cpp
# Opt level: O0

void __thiscall HFactor::updatePF(HFactor *this,HVector *aq,HighsInt iRow,HighsInt *hint)

{
  int iVar1;
  int *piVar2;
  undefined4 *in_RCX;
  int in_EDX;
  long in_RSI;
  value_type_conflict1 *in_RDI;
  double value;
  HighsInt index;
  HighsInt i;
  double *columnArray;
  HighsInt *variable_index;
  HighsInt column_count;
  value_type_conflict1 *__x;
  vector<int,_std::allocator<int>_> *this_00;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  int local_3c;
  
  iVar1 = *(int *)(in_RSI + 0x7c);
  piVar2 = std::vector<int,_std::allocator<int>_>::data
                     ((vector<int,_std::allocator<int>_> *)0x7d37ce);
  std::vector<double,_std::allocator<double>_>::data
            ((vector<double,_std::allocator<double>_> *)0x7d37e4);
  for (local_3c = 0; local_3c < iVar1; local_3c = local_3c + 1) {
    if (piVar2[local_3c] != in_EDX) {
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)
                 CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                 (value_type_conflict2 *)in_RDI);
      std::vector<double,_std::allocator<double>_>::push_back
                ((vector<double,_std::allocator<double>_> *)
                 CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),in_RDI);
    }
  }
  std::vector<int,_std::allocator<int>_>::push_back
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
             (value_type_conflict2 *)in_RDI);
  __x = in_RDI + 0xca;
  std::vector<double,_std::allocator<double>_>::operator[]
            ((vector<double,_std::allocator<double>_> *)(in_RSI + 0x20),(long)in_EDX);
  std::vector<double,_std::allocator<double>_>::push_back
            ((vector<double,_std::allocator<double>_> *)
             CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),in_RDI);
  this_00 = (vector<int,_std::allocator<int>_> *)(in_RDI + 0xd0);
  std::vector<int,_std::allocator<int>_>::size((vector<int,_std::allocator<int>_> *)(in_RDI + 0xd3))
  ;
  std::vector<int,_std::allocator<int>_>::push_back(this_00,(value_type_conflict2 *)__x);
  *(int *)((long)in_RDI + 0x574) = *(int *)(in_RSI + 0x7c) + *(int *)((long)in_RDI + 0x574);
  if (*(int *)(in_RDI + 0xae) < *(int *)((long)in_RDI + 0x574)) {
    *in_RCX = 1;
  }
  return;
}

Assistant:

void HFactor::updatePF(HVector* aq, HighsInt iRow, HighsInt* hint) {
  // Check space
  const HighsInt column_count = aq->packCount;
  const HighsInt* variable_index = aq->packIndex.data();
  const double* columnArray = aq->packValue.data();

  // Copy the pivotal column
  for (HighsInt i = 0; i < column_count; i++) {
    HighsInt index = variable_index[i];
    double value = columnArray[i];
    if (index != iRow) {
      pf_index.push_back(index);
      pf_value.push_back(value);
    }
  }

  // Save pivot
  pf_pivot_index.push_back(iRow);
  pf_pivot_value.push_back(aq->array[iRow]);
  pf_start.push_back(pf_index.size());

  // Check refactor
  u_total_x += aq->packCount;
  if (u_total_x > u_merit_x) *hint = 1;
}